

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teleport.c
# Opt level: O1

void teleds(int nux,int nuy,boolean allow_drag)

{
  xchar x;
  xchar y;
  bool bVar1;
  monst *pmVar2;
  bool bVar3;
  byte bVar4;
  boolean bVar5;
  int iVar6;
  bool bVar7;
  xchar chainy;
  xchar chainx;
  xchar bally;
  xchar ballx;
  boolean cause_delay;
  int bc_control;
  
  y = (xchar)nuy;
  x = (xchar)nux;
  if (uball == (obj *)0x0) {
    bVar7 = false;
  }
  else {
    bVar7 = uball->where != '\0';
  }
  if (bVar7) {
    if (uball->where != '\x03') {
      iVar6 = distmin(nux,nuy,(int)uball->ox,(int)uball->oy);
      bVar1 = true;
      if (iVar6 < 3) goto LAB_002588dd;
    }
    if (allow_drag != '\0') {
      iVar6 = distmin((int)u.ux,(int)u.uy,nux,nuy);
      if (iVar6 < 2) goto LAB_002588da;
    }
    unplacebc();
    allow_drag = '\0';
  }
LAB_002588da:
  bVar1 = false;
LAB_002588dd:
  u.utrap = 0;
  u.ustuck = (monst *)0x0;
  u.ux0 = u.ux;
  u.uy0 = u.uy;
  if (((youmonst.data)->mflags1 & 0x80) == 0) {
    if ((youmonst.data)->mlet == '9') {
      u._1052_1_ = u._1052_1_ & 0x7f;
      bVar4 = is_pool(level,nux,nuy);
      u._1052_1_ = u._1052_1_ & 0xfb | (bVar4 & 1) << 2;
    }
    else {
      u._1052_1_ = u._1052_1_ & 0x7b;
      if ((youmonst.data)->mlet == '\r') {
        youmonst.m_ap_type = '\0';
      }
    }
  }
  else {
    u._1052_1_ = u._1052_1_ & 0x7b | (level->objects[nux][nuy] != (obj *)0x0) << 2;
  }
  if ((u._1052_1_ & 1) != 0) {
    u._1052_1_ = u._1052_1_ & 0xfe;
    u.uswldtim = 0;
    if (uball != (obj *)0x0 && !bVar7) {
      allow_drag = '\0';
    }
    bVar3 = true;
    if (uball == (obj *)0x0 || bVar7) {
      bVar3 = bVar7;
    }
    bVar7 = bVar3;
    doredraw();
  }
  if ((bool)(bVar7 & (bVar1 | allow_drag != '\0'))) {
    bVar5 = drag_ball(x,y,&bc_control,&ballx,&bally,&chainx,&chainy,&cause_delay,allow_drag);
    if (bVar5 != '\0') {
      move_bc(0,bc_control,ballx,bally,chainx,chainy);
    }
  }
  u.uy = y;
  u.ux = x;
  fill_pit(level,(int)u.ux0,(int)u.uy0);
  if (bVar7 && (!bVar1 && allow_drag == '\0')) {
    placebc();
  }
  initrack();
  update_player_regions(level);
  pmVar2 = u.usteed;
  if (u.usteed != (monst *)0x0) {
    (u.usteed)->mx = x;
    pmVar2->my = y;
  }
  newsym((int)u.ux0,(int)u.uy0);
  see_monsters();
  vision_full_recalc = '\x01';
  nomul(0,(char *)0x0);
  vision_recalc(0);
  spoteffects('\x01');
  invocation_message();
  return;
}

Assistant:

void teleds(int nux, int nuy, boolean allow_drag)
{
	boolean ball_active = (Punished && uball->where != OBJ_FREE),
		ball_still_in_range = FALSE;

	/* If they have to move the ball, then drag if allow_drag is true;
	 * otherwise they are teleporting, so unplacebc().  
	 * If they don't have to move the ball, then always "drag" whether or
	 * not allow_drag is true, because we are calling that function, not
	 * to drag, but to move the chain.  *However* there are some dumb
	 * special cases:
	 *    0				 0
	 *   _X  move east       ----->  X_
	 *    @				  @
	 * These are permissible if teleporting, but not if dragging.  As a
	 * result, drag_ball() needs to know about allow_drag and might end
	 * up dragging the ball anyway.  Also, drag_ball() might find that
	 * dragging the ball is completely impossible (ball in range but there's
	 * rock in the way), in which case it teleports the ball on its own.
	 */
	if (ball_active) {
	    if (!carried(uball) && distmin(nux, nuy, uball->ox, uball->oy) <= 2)
		ball_still_in_range = TRUE; /* don't have to move the ball */
	    else {
		/* have to move the ball */
		if (!allow_drag || distmin(u.ux, u.uy, nux, nuy) > 1) {
		    /* we should not have dist > 1 and allow_drag at the same
		     * time, but just in case, we must then revert to teleport.
		     */
		    allow_drag = FALSE;
		    unplacebc();
		}
	    }
	}
	u.utrap = 0;
	u.ustuck = 0;
	u.uwilldrown = 0;
	u.ux0 = u.ux;
	u.uy0 = u.uy;

	if (hides_under(youmonst.data))
		u.uundetected = OBJ_AT(nux, nuy);
	else if (youmonst.data->mlet == S_EEL)
		u.uundetected = is_pool(level, nux, nuy);
	else {
		u.uundetected = 0;
		/* mimics stop being unnoticed */
		if (youmonst.data->mlet == S_MIMIC)
		    youmonst.m_ap_type = M_AP_NOTHING;
	}

	if (u.uswallow) {
		u.uswldtim = u.uswallow = 0;
		if (Punished && !ball_active) {
		    /* ensure ball placement, like unstuck */
		    ball_active = TRUE;
		    allow_drag = FALSE;
		}
		doredraw();
	}
	if (ball_active) {
	    if (ball_still_in_range || allow_drag) {
		int bc_control;
		xchar ballx, bally, chainx, chainy;
		boolean cause_delay;

		if (drag_ball(nux, nuy, &bc_control, &ballx, &bally,
				    &chainx, &chainy, &cause_delay, allow_drag))
		    move_bc(0, bc_control, ballx, bally, chainx, chainy);
	    }
	}
	/* must set u.ux, u.uy after drag_ball(), which may need to know
	   the old position if allow_drag is true... */
	u.ux = nux;
	u.uy = nuy;
	fill_pit(level, u.ux0, u.uy0);
	if (ball_active) {
	    if (!ball_still_in_range && !allow_drag)
		placebc();
	}
	initrack(); /* teleports mess up tracking monsters without this */
	update_player_regions(level);
	/* Move your steed, too */
	if (u.usteed) {
		u.usteed->mx = nux;
		u.usteed->my = nuy;
	}

	/*
	 *  Make sure the hero disappears from the old location.  This will
	 *  not happen if she is teleported within sight of her previous
	 *  location.  Force a full vision recalculation because the hero
	 *  is now in a new location.
	 */
	newsym(u.ux0,u.uy0);
	see_monsters();
	vision_full_recalc = 1;
	nomul(0, NULL);
	vision_recalc(0);	/* vision before effects */
	spoteffects(TRUE);
	invocation_message();
}